

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O3

HeaderSize HPack::header_size(HttpHeader *header)

{
  pointer pHVar1;
  HeaderSize HVar2;
  HeaderSize HVar3;
  storage_type *in_R8;
  uint uVar4;
  HeaderField *field;
  pointer pHVar5;
  QByteArrayView name;
  QByteArrayView value;
  
  HVar2.first = true;
  HVar2._1_3_ = 0xaaaaaa;
  HVar2.second = 0;
  pHVar5 = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pHVar5 != pHVar1) {
    uVar4 = 0;
    do {
      name.m_data = (storage_type *)(pHVar5->value).d.size;
      name.m_size = (qsizetype)(pHVar5->name).d.ptr;
      value.m_data = in_R8;
      value.m_size = (qsizetype)(pHVar5->value).d.ptr;
      HVar2 = entry_size((HPack *)(pHVar5->name).d.size,name,value);
      if ((((ulong)HVar2 & 1) == 0) || (~uVar4 < HVar2.second)) {
        HVar3.first = false;
        HVar3._1_3_ = 0xaaaaaa;
        HVar3.second = 0;
        return HVar3;
      }
      uVar4 = uVar4 + HVar2.second;
      pHVar5 = pHVar5 + 1;
    } while (pHVar5 != pHVar1);
    HVar2 = (HeaderSize)((ulong)uVar4 << 0x20 | 0xaaaaaa01);
  }
  return HVar2;
}

Assistant:

HeaderSize header_size(const HttpHeader &header)
{
    HeaderSize size(true, 0);
    for (const HeaderField &field : header) {
        HeaderSize delta = entry_size(field);
        if (!delta.first)
            return HeaderSize();
        if (std::numeric_limits<quint32>::max() - size.second < delta.second)
            return HeaderSize();
        size.second += delta.second;
    }

    return size;
}